

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::BaseTriangleTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BaseTriangleTestInstance *this)

{
  deUint32 width;
  bool bVar1;
  int iVar2;
  ScopedLogSection section;
  Surface resultImage;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  IVec4 colorBits;
  string iterationDescription;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ScopedLogSection local_d0;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  RasterizationArguments local_5c;
  tcu local_48 [8];
  int local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_5c.numSamples = this->m_iteration + 1;
  de::toString<int>(&local_88,&local_5c.numSamples);
  std::operator+(&local_a8,"Test iteration ",&local_88);
  std::operator+(&local_f8,&local_a8," / ");
  de::toString<int>(&local_c8,&this->m_iterationCount);
  std::operator+(&local_38,&local_f8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  tcu::ScopedLogSection::ScopedLogSection
            (&local_d0,
             ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
             m_log,&local_38,&local_38);
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface((Surface *)&local_a8,width,width);
  local_88.field_2._M_allocated_capacity = 0;
  local_c8.field_2._M_allocated_capacity = 0;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_c8._M_dataplus._M_p = (pointer)0x0;
  local_c8._M_string_length = 0;
  (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[7])
            (this,(ulong)(uint)this->m_iteration);
  BaseRenderingTestInstance::drawPrimitives
            (&this->super_BaseRenderingTestInstance,(Surface *)&local_a8,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_88,
             this->m_primitiveTopology);
  local_f8._M_dataplus._M_p = (pointer)0x0;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity = 0;
  tcu::getTextureFormatBitDepth(local_48,&(this->super_BaseRenderingTestInstance).m_textureFormat);
  local_5c.numSamples = (int)((this->super_BaseRenderingTestInstance).m_multisampling != 0);
  local_5c.subpixelBits = (this->super_BaseRenderingTestInstance).m_subpixelBits;
  local_5c._8_8_ = local_48;
  local_5c.blueBits = local_40;
  local_f8._M_dataplus._M_p = local_c8._M_dataplus._M_p;
  local_f8._M_string_length = local_c8._M_string_length;
  local_f8.field_2._M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
  local_c8.field_2._M_allocated_capacity = 0;
  local_c8._M_dataplus._M_p = (pointer)0x0;
  local_c8._M_string_length = 0;
  bVar1 = tcu::verifyTriangleGroupRasterization
                    ((Surface *)&local_a8,(TriangleSceneSpec *)&local_f8,&local_5c,
                     ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                     m_testCtx->m_log,VERIFICATIONMODE_STRICT);
  if (!bVar1) {
    this->m_allIterationsPassed = false;
  }
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base((_Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&local_f8);
  iVar2 = this->m_iteration + 1;
  this->m_iteration = iVar2;
  if (iVar2 == this->m_iterationCount) {
    if (this->m_allIterationsPassed == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Pass",(allocator<char> *)&local_5c);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_f8);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Incorrect rasterization",(allocator<char> *)&local_5c);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_f8);
    }
    std::__cxx11::string::~string((string *)&local_f8);
  }
  else {
    tcu::TestStatus::incomplete();
  }
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base((_Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&local_c8);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &local_88);
  tcu::Surface::~Surface((Surface *)&local_a8);
  tcu::ScopedLogSection::~ScopedLogSection(&local_d0);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BaseTriangleTestInstance::iterate (void)
{
	const std::string								iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection						section					(m_context.getTestContext().getLog(), iterationDescription, iterationDescription);
	tcu::Surface									resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	generateTriangles(m_iteration, drawBuffer, triangles);

	// draw image
	drawPrimitives(resultImage, drawBuffer, m_primitiveTopology);

	// compare
	{
		bool					compareOk;
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		tcu::IVec4				colorBits = tcu::getTextureFormatBitDepth(getTextureFormat());

		args.numSamples		= m_multisampling ? 1 : 0;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= colorBits[0];
		args.greenBits		= colorBits[1];
		args.blueBits		= colorBits[2];

		scene.triangles.swap(triangles);

		compareOk = verifyTriangleGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog());

		if (!compareOk)
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Incorrect rasterization");
	}
	else
		return tcu::TestStatus::incomplete();
}